

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

Address * __thiscall
cfd::core::DescriptorScriptReference::GenerateAddress
          (Address *__return_storage_ptr__,DescriptorScriptReference *this,NetType net_type)

{
  pointer *__return_storage_ptr___00;
  bool bVar1;
  uint uVar2;
  NetType NVar3;
  WitnessVersion WVar4;
  CfdException *pCVar5;
  reference pvVar6;
  const_reference this_00;
  undefined1 local_1b8 [8];
  Pubkey pubkey;
  ByteData local_188;
  undefined1 local_16a;
  allocator local_169;
  string local_168;
  CfdSourceLocation local_148;
  undefined1 local_12a;
  allocator local_129;
  string local_128;
  CfdSourceLocation local_108;
  ByteData160 local_f0;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_d8;
  undefined1 local_c0 [8];
  ByteData hash_2;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_90;
  undefined1 local_78 [8];
  ByteData hash_1;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_50;
  undefined1 local_38 [8];
  ByteData hash;
  bool is_witness;
  bool is_key;
  NetType net_type_local;
  DescriptorScriptReference *this_local;
  
  hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  uVar2 = this->script_type_ - kDescriptorScriptWsh;
  hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = net_type;
  if (uVar2 < 10 || this->script_type_ == kDescriptorScriptTaproot) {
    switch((long)&switchD_0027a956::switchdataD_00382378 +
           (long)(int)(&switchD_0027a956::switchdataD_00382378)[uVar2]) {
    case 0x27a958:
      bVar1 = Script::IsP2wpkhScript(&this->locking_script_);
      if (((bVar1) || (bVar1 = Script::IsTaprootScript(&this->locking_script_), bVar1)) ||
         (bVar1 = Script::IsP2wshScript(&this->locking_script_), bVar1)) {
        Script::GetElementList(&local_50,&this->locking_script_);
        pvVar6 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ::operator[](&local_50,1);
        ScriptElement::GetBinaryData((ByteData *)local_38,pvVar6);
        ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                  (&local_50);
        NVar3 = hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._4_4_;
        WVar4 = Script::GetWitnessVersion(&this->locking_script_);
        core::Address::Address
                  (__return_storage_ptr__,NVar3,WVar4,(ByteData *)local_38,&this->addr_prefixes_);
        ByteData::~ByteData((ByteData *)local_38);
        return __return_storage_ptr__;
      }
      bVar1 = Script::IsP2shScript(&this->locking_script_);
      if (bVar1) {
        Script::GetElementList(&local_90,&this->locking_script_);
        pvVar6 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ::operator[](&local_90,1);
        ScriptElement::GetBinaryData((ByteData *)local_78,pvVar6);
        ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                  (&local_90);
        NVar3 = hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._4_4_;
        ByteData160::ByteData160
                  ((ByteData160 *)
                   &hash_2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)local_78);
        core::Address::Address
                  (__return_storage_ptr__,NVar3,kP2shAddress,
                   (ByteData160 *)
                   &hash_2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,&this->addr_prefixes_);
        ByteData160::~ByteData160
                  ((ByteData160 *)
                   &hash_2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        ByteData::~ByteData((ByteData *)local_78);
        return __return_storage_ptr__;
      }
      bVar1 = Script::IsP2pkhScript(&this->locking_script_);
      if (bVar1) {
        Script::GetElementList(&local_d8,&this->locking_script_);
        pvVar6 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ::operator[](&local_d8,2);
        ScriptElement::GetBinaryData((ByteData *)local_c0,pvVar6);
        ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                  (&local_d8);
        NVar3 = hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._4_4_;
        ByteData160::ByteData160(&local_f0,(ByteData *)local_c0);
        core::Address::Address
                  (__return_storage_ptr__,NVar3,kP2pkhAddress,&local_f0,&this->addr_prefixes_);
        ByteData160::~ByteData160(&local_f0);
        ByteData::~ByteData((ByteData *)local_c0);
        return __return_storage_ptr__;
      }
      local_108.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_108.filename = local_108.filename + 1;
      local_108.line = 0x264;
      local_108.funcname = "GenerateAddress";
      logger::warn<>(&local_108,"raw type descriptor is not support.");
      local_12a = 1;
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_128,"raw type descriptor is not support.",&local_129);
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_128);
      local_12a = 0;
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    case 0x27adc9:
      NVar3 = core::Address::GetNetType(&this->address_script_);
      if (net_type == NVar3) {
        core::Address::Address(__return_storage_ptr__,&this->address_script_);
        return __return_storage_ptr__;
      }
      local_148.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
                   ,0x2f);
      local_148.filename = local_148.filename + 1;
      local_148.line = 0x26a;
      local_148.funcname = "GenerateAddress";
      logger::warn<>(&local_148,"Failed to nettype. unmatch address nettype.");
      local_16a = 1;
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_168,"unmatch address nettype.",&local_169);
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_168);
      local_16a = 0;
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    case 0x27af2f:
      hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
    case 0x27af33:
      hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      break;
    case 0x27af3c:
      bVar1 = Script::IsP2shScript(&this->locking_script_);
      if (!bVar1) {
        hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
        hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._2_1_ =
             Script::IsP2wpkhScript(&this->locking_script_);
      }
      break;
    case 0x27af6e:
      hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
      break;
    case 0x27af77:
      WVar4 = Script::GetWitnessVersion(&this->locking_script_);
      __return_storage_ptr___00 =
           &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
      Script::GetElementList
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 __return_storage_ptr___00,&this->locking_script_);
      pvVar6 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
               operator[]((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           *)__return_storage_ptr___00,1);
      ScriptElement::GetBinaryData(&local_188,pvVar6);
      core::Address::Address(__return_storage_ptr__,net_type,WVar4,&local_188,&this->addr_prefixes_)
      ;
      ByteData::~ByteData(&local_188);
      ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
                ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    case 0x27b05c:
      goto switchD_0027a956_caseD_27b05c;
    }
  }
  else {
switchD_0027a956_caseD_27b05c:
  }
  if ((hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
    if (this->script_type_ == kDescriptorScriptWsh) {
      core::Address::Address
                (__return_storage_ptr__,
                 hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,kVersion0,
                 &this->redeem_script_,&this->addr_prefixes_);
    }
    else if (this->script_type_ == kDescriptorScriptWsh) {
      core::Address::Address
                (__return_storage_ptr__,
                 hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,kVersion0,
                 &this->redeem_script_,&this->addr_prefixes_);
    }
    else {
      core::Address::Address
                (__return_storage_ptr__,
                 hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,&this->redeem_script_,
                 &this->addr_prefixes_);
    }
  }
  else {
    this_00 = ::std::
              vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
              ::operator[](&this->keys_,0);
    DescriptorKeyReference::GetPubkey((Pubkey *)local_1b8,this_00);
    if ((hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._2_1_ & 1) == 0) {
      core::Address::Address
                (__return_storage_ptr__,
                 hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(Pubkey *)local_1b8,
                 &this->addr_prefixes_);
    }
    else {
      core::Address::Address
                (__return_storage_ptr__,
                 hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,kVersion0,
                 (Pubkey *)local_1b8,&this->addr_prefixes_);
    }
    Pubkey::~Pubkey((Pubkey *)local_1b8);
  }
  return __return_storage_ptr__;
}

Assistant:

Address DescriptorScriptReference::GenerateAddress(NetType net_type) const {
  bool is_key = false;
  bool is_witness = false;
  switch (script_type_) {
    case DescriptorScriptType::kDescriptorScriptRaw:
      if (locking_script_.IsP2wpkhScript() ||
          locking_script_.IsTaprootScript() ||
          locking_script_.IsP2wshScript()) {
        auto hash = locking_script_.GetElementList()[1].GetBinaryData();
        return Address(
            net_type, locking_script_.GetWitnessVersion(), hash,
            addr_prefixes_);
      } else if (locking_script_.IsP2shScript()) {
        auto hash = locking_script_.GetElementList()[1].GetBinaryData();
        return Address(
            net_type, AddressType::kP2shAddress, ByteData160(hash),
            addr_prefixes_);
      } else if (locking_script_.IsP2pkhScript()) {
        auto hash = locking_script_.GetElementList()[2].GetBinaryData();
        return Address(
            net_type, AddressType::kP2pkhAddress, ByteData160(hash),
            addr_prefixes_);
      }
      warn(CFD_LOG_SOURCE, "raw type descriptor is not support.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "raw type descriptor is not support.");
    case DescriptorScriptType::kDescriptorScriptAddr:
      if (net_type != address_script_.GetNetType()) {
        warn(CFD_LOG_SOURCE, "Failed to nettype. unmatch address nettype.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "unmatch address nettype.");
      }
      return address_script_;
    case DescriptorScriptType::kDescriptorScriptWpkh:
      is_witness = true;
      // fall-through
    case DescriptorScriptType::kDescriptorScriptPk:
    case DescriptorScriptType::kDescriptorScriptPkh:
    case DescriptorScriptType::kDescriptorScriptMulti:
    case DescriptorScriptType::kDescriptorScriptSortedMulti:
      is_key = true;
      break;
    case DescriptorScriptType::kDescriptorScriptCombo:
      if (!locking_script_.IsP2shScript()) {
        is_key = true;
        is_witness = locking_script_.IsP2wpkhScript();
      }
      break;
    case DescriptorScriptType::kDescriptorScriptWsh:
      is_witness = true;
      break;
    case DescriptorScriptType::kDescriptorScriptTaproot:
      return Address(
          net_type, locking_script_.GetWitnessVersion(),
          locking_script_.GetElementList()[1].GetBinaryData(), addr_prefixes_);
    default:
      // case DescriptorScriptType::kDescriptorScriptSh:
      break;
  }
  if (is_key) {
    Pubkey pubkey = keys_[0].GetPubkey();
    if (is_witness) {
      return Address(
          net_type, WitnessVersion::kVersion0, pubkey, addr_prefixes_);
    } else {
      return Address(net_type, pubkey, addr_prefixes_);
    }
  }

  if (script_type_ == DescriptorScriptType::kDescriptorScriptWsh) {
    return Address(
        net_type, WitnessVersion::kVersion0, redeem_script_, addr_prefixes_);
  }
  if (script_type_ == DescriptorScriptType::kDescriptorScriptWsh) {
    return Address(
        net_type, WitnessVersion::kVersion0, redeem_script_, addr_prefixes_);
  }
  return Address(net_type, redeem_script_, addr_prefixes_);
}